

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void anon_unknown.dwarf_19d1ab4::handleSystemIncludesDep
               (cmLocalGenerator *lg,cmGeneratorTarget *depTgt,string *config,
               cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result,bool excludeImported,string *language)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  cmValue cVar4;
  string_view arg;
  string_view arg_00;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_88;
  cmGeneratorTarget *local_80;
  cmGeneratorExpressionDAGChecker *local_78;
  string local_70;
  string local_50;
  
  paVar1 = &local_a8.field_2;
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  local_88 = result;
  local_80 = headTarget;
  local_78 = dagChecker;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
  cVar4 = cmGeneratorTarget::GetProperty(depTgt,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value != (string *)0x0) {
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
    cmGeneratorExpression::Evaluate(&local_a8,&local_50,lg,config,local_80,local_78,depTgt,language)
    ;
    arg._M_str = local_a8._M_dataplus._M_p;
    arg._M_len = local_a8._M_string_length;
    cmExpandList(arg,local_88,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"SYSTEM","");
  bVar3 = cmTarget::GetPropertyAsBool(depTgt->Target,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar3) {
    return;
  }
  bVar3 = cmTarget::IsImported(depTgt->Target);
  if (bVar3) {
    if (excludeImported) {
      return;
    }
    local_a8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"IMPORTED_NO_SYSTEM","");
    bVar3 = cmTarget::GetPropertyAsBool(depTgt->Target,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      return;
    }
  }
  local_a8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,"INTERFACE_INCLUDE_DIRECTORIES","");
  cVar4 = cmGeneratorTarget::GetProperty(depTgt,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if (cVar4.Value != (string *)0x0) {
    pcVar2 = ((cVar4.Value)->_M_dataplus)._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + (cVar4.Value)->_M_string_length);
    cmGeneratorExpression::Evaluate(&local_a8,&local_70,lg,config,local_80,local_78,depTgt,language)
    ;
    arg_00._M_str = local_a8._M_dataplus._M_p;
    arg_00._M_len = local_a8._M_string_length;
    cmExpandList(arg_00,local_88,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != paVar1) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void handleSystemIncludesDep(cmLocalGenerator* lg,
                             cmGeneratorTarget const* depTgt,
                             const std::string& config,
                             cmGeneratorTarget const* headTarget,
                             cmGeneratorExpressionDAGChecker* dagChecker,
                             std::vector<std::string>& result,
                             bool excludeImported, std::string const& language)
{
  if (cmValue dirs =
        depTgt->GetProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
  if (!depTgt->GetPropertyAsBool("SYSTEM")) {
    return;
  }
  if (depTgt->IsImported()) {
    if (excludeImported) {
      return;
    }
    if (depTgt->GetPropertyAsBool("IMPORTED_NO_SYSTEM")) {
      return;
    }
  }

  if (cmValue dirs = depTgt->GetProperty("INTERFACE_INCLUDE_DIRECTORIES")) {
    cmExpandList(cmGeneratorExpression::Evaluate(*dirs, lg, config, headTarget,
                                                 dagChecker, depTgt, language),
                 result);
  }
}